

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_decompress_block.c
# Opt level: O1

size_t ZSTD_decompressSequences
                 (ZSTD_DCtx *dctx,void *dst,size_t maxDstSize,void *seqStart,size_t seqSize,
                 int nbSeq,ZSTD_longOffset_e isLongOffset)

{
  BYTE *pBVar1;
  BYTE *pBVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  BYTE BVar6;
  BYTE *base;
  seq_t sequence;
  bool bVar7;
  uint uVar8;
  BYTE *op_2;
  long lVar9;
  BYTE *pBVar10;
  BYTE *oend_00;
  BYTE *litLimit;
  BYTE *pBVar11;
  BYTE *pBVar12;
  int iVar13;
  BYTE *oend;
  BYTE *pBVar14;
  uint uVar15;
  BYTE *pBVar16;
  ulong uVar17;
  BYTE *ip_1;
  ulong uVar18;
  ulong uVar19;
  size_t sVar20;
  BYTE *litPtr;
  seqState_t seqState;
  BYTE *local_120;
  BIT_DStream_t local_118;
  ZSTD_fseState local_f0;
  ZSTD_fseState local_e0;
  ZSTD_fseState local_d0;
  ulong local_c0 [6];
  int local_8c;
  BYTE *local_88;
  BYTE *local_80;
  BYTE *local_78;
  ZSTD_DCtx *local_70;
  ulong local_68;
  ulong local_60;
  ulong local_58;
  ulong local_50;
  size_t sStack_48;
  ulong local_40;
  BYTE *pBStack_38;
  
  oend_00 = (BYTE *)(maxDstSize + (long)dst);
  local_120 = dctx->litPtr;
  litLimit = local_120 + dctx->litSize;
  pBVar16 = (BYTE *)dst;
  if (nbSeq == 0) goto LAB_004be882;
  base = (BYTE *)dctx->prefixStart;
  local_80 = (BYTE *)dctx->virtualStart;
  local_88 = (BYTE *)dctx->dictEnd;
  dctx->fseEntropy = 1;
  lVar9 = -0xc;
  do {
    *(ulong *)((long)local_c0 + lVar9 * 2 + 0x18) = (ulong)*(uint *)((long)dctx->workspace + lVar9);
    lVar9 = lVar9 + 4;
  } while (lVar9 != 0);
  if (seqSize == 0) {
    local_118.ptr = (char *)0x0;
    local_118.start = (char *)0x0;
    local_118.bitContainer = 0;
    local_118.bitsConsumed = 0;
    local_118._12_4_ = 0;
    local_118.limitPtr = (char *)0x0;
LAB_004be1a2:
    bVar7 = false;
    uVar17 = 0xffffffffffffffec;
  }
  else {
    local_118.limitPtr = (char *)((long)seqStart + 8);
    local_118.start = (char *)seqStart;
    if (seqSize < 8) {
      local_118.bitContainer = (size_t)*seqStart;
      switch(seqSize) {
      case 7:
        local_118.bitContainer =
             (ulong)*(byte *)((long)seqStart + 6) << 0x30 | local_118.bitContainer;
      case 6:
        local_118.bitContainer =
             local_118.bitContainer + ((ulong)*(byte *)((long)seqStart + 5) << 0x28);
      case 5:
        local_118.bitContainer =
             local_118.bitContainer + ((ulong)*(byte *)((long)seqStart + 4) << 0x20);
      case 4:
        local_118.bitContainer =
             local_118.bitContainer + (ulong)*(byte *)((long)seqStart + 3) * 0x1000000;
      case 3:
        local_118.bitContainer =
             local_118.bitContainer + (ulong)*(byte *)((long)seqStart + 2) * 0x10000;
      case 2:
        local_118.bitContainer =
             local_118.bitContainer + (ulong)*(byte *)((long)seqStart + 1) * 0x100;
      }
      bVar3 = *(byte *)((long)seqStart + (seqSize - 1));
      uVar8 = 0x1f;
      if (bVar3 != 0) {
        for (; bVar3 >> uVar8 == 0; uVar8 = uVar8 - 1) {
        }
      }
      local_118.bitsConsumed = ~uVar8 + 9;
      if (bVar3 == 0) {
        local_118.bitsConsumed = 0;
      }
      local_118.ptr = (char *)seqStart;
      if (bVar3 == 0) goto LAB_004be1a2;
      local_118.bitsConsumed = local_118.bitsConsumed + (int)seqSize * -8 + 0x40;
    }
    else {
      local_118.ptr = (char *)((long)seqStart + (seqSize - 8));
      local_118.bitContainer = *(size_t *)local_118.ptr;
      bVar3 = *(byte *)((long)seqStart + (seqSize - 1));
      uVar8 = 0x1f;
      if (bVar3 != 0) {
        for (; bVar3 >> uVar8 == 0; uVar8 = uVar8 - 1) {
        }
      }
      local_118.bitsConsumed = ~uVar8 + 9;
      if (bVar3 == 0) {
        local_118.bitsConsumed = 0;
      }
      if (bVar3 == 0 || 0xffffffffffffff88 < seqSize) goto LAB_004be1a2;
    }
    ZSTD_initFseState(&local_f0,&local_118,dctx->LLTptr);
    ZSTD_initFseState(&local_e0,&local_118,dctx->OFTptr);
    ZSTD_initFseState(&local_d0,&local_118,dctx->MLTptr);
    pBVar1 = oend_00 + -8;
    local_78 = oend_00 + -0xd;
    local_70 = dctx;
    uVar17 = 0xffffffffffffffec;
    do {
      uVar19 = local_c0[1];
      uVar8 = local_118.bitsConsumed;
      if (local_118.bitsConsumed < 0x41) {
        if (local_118.ptr < local_118.limitPtr) {
          if (local_118.ptr == local_118.start) goto LAB_004be337;
          uVar18 = (ulong)(uint)((int)local_118.ptr - (int)local_118.start);
          if (local_118.start <=
              (ulong *)((long)local_118.ptr - (ulong)(local_118.bitsConsumed >> 3))) {
            uVar18 = (ulong)(local_118.bitsConsumed >> 3);
          }
          uVar15 = local_118.bitsConsumed + (int)uVar18 * -8;
        }
        else {
          uVar18 = (ulong)(local_118.bitsConsumed >> 3);
          uVar15 = local_118.bitsConsumed & 7;
        }
        local_118.ptr = (char *)((long)local_118.ptr - uVar18);
        local_118.bitsConsumed = uVar15;
        local_118.bitContainer = *(size_t *)local_118.ptr;
      }
LAB_004be337:
      if ((0x40 < uVar8) || (nbSeq == 0)) {
        if (nbSeq == 0) {
          lVar9 = 0;
          do {
            (local_70->entropy).rep[lVar9] = (U32)local_c0[lVar9];
            lVar9 = lVar9 + 1;
          } while (lVar9 != 3);
          bVar7 = true;
          goto LAB_004be87e;
        }
        uVar19 = 0xffffffffffffffec;
        break;
      }
      bVar3 = local_f0.table[local_f0.state].nbAdditionalBits;
      bVar4 = local_d0.table[local_d0.state].nbAdditionalBits;
      bVar5 = local_e0.table[local_e0.state].nbAdditionalBits;
      local_60 = (ulong)local_f0.table[local_f0.state].baseValue;
      local_68 = (ulong)local_d0.table[local_d0.state].baseValue;
      if (bVar5 == 0) {
        uVar18 = 0;
      }
      else {
        uVar18 = ((local_118.bitContainer << ((byte)local_118.bitsConsumed & 0x3f)) >>
                 (-bVar5 & 0x3f)) + (ulong)local_e0.table[local_e0.state].baseValue;
        local_118.bitsConsumed = local_118.bitsConsumed + bVar5;
      }
      local_58 = uVar17;
      local_8c = nbSeq + -1;
      if (bVar5 < 2) {
        lVar9 = uVar18 + (local_60 == 0);
        if (lVar9 != 0) {
          if (lVar9 == 3) {
            uVar17 = local_c0[0] - 1;
          }
          else {
            uVar17 = local_c0[lVar9];
          }
          if (lVar9 != 1) {
            local_c0[2] = local_c0[1];
          }
          local_c0[1] = local_c0[0];
          local_c0[0] = uVar17 + (uVar17 == 0);
        }
      }
      else {
        local_c0[1] = local_c0[0];
        local_c0[2] = uVar19;
        local_c0[0] = uVar18;
      }
      uVar17 = local_c0[0];
      if (bVar4 == 0) {
        uVar19 = 0;
      }
      else {
        uVar19 = (local_118.bitContainer << ((byte)local_118.bitsConsumed & 0x3f)) >>
                 (-bVar4 & 0x3f);
        local_118.bitsConsumed = local_118.bitsConsumed + bVar4;
      }
      if ((0x1e < (uint)bVar4 + (uint)bVar3 + (uint)bVar5) && (local_118.bitsConsumed < 0x41)) {
        if (local_118.ptr < local_118.limitPtr) {
          if (local_118.ptr == local_118.start) goto LAB_004be505;
          uVar18 = (ulong)(uint)((int)local_118.ptr - (int)local_118.start);
          if (local_118.start <=
              (ulong *)((long)local_118.ptr - (ulong)(local_118.bitsConsumed >> 3))) {
            uVar18 = (ulong)(local_118.bitsConsumed >> 3);
          }
          uVar8 = local_118.bitsConsumed + (int)uVar18 * -8;
        }
        else {
          uVar18 = (ulong)(local_118.bitsConsumed >> 3);
          uVar8 = local_118.bitsConsumed & 7;
        }
        local_118.ptr = (char *)((long)local_118.ptr - uVar18);
        local_118.bitsConsumed = uVar8;
        local_118.bitContainer = *(size_t *)local_118.ptr;
      }
LAB_004be505:
      if (bVar3 == 0) {
        local_50 = 0;
      }
      else {
        local_50 = (local_118.bitContainer << ((byte)local_118.bitsConsumed & 0x3f)) >>
                   (-bVar3 & 0x3f);
        local_118.bitsConsumed = local_118.bitsConsumed + bVar3;
      }
      iVar13 = local_118.bitsConsumed + local_f0.table[local_f0.state].nbBits;
      sVar20 = uVar19 + local_d0.table[local_d0.state].baseValue;
      local_f0.state =
           (ulong)((uint)(local_118.bitContainer >> (-(char)iVar13 & 0x3fU)) &
                  BIT_mask[local_f0.table[local_f0.state].nbBits]) +
           (ulong)local_f0.table[local_f0.state].nextState;
      iVar13 = iVar13 + (uint)local_d0.table[local_d0.state].nbBits;
      local_d0.state =
           (ulong)((uint)(local_118.bitContainer >> (-(char)iVar13 & 0x3fU)) &
                  BIT_mask[local_d0.table[local_d0.state].nbBits]) +
           (ulong)local_d0.table[local_d0.state].nextState;
      uVar8 = iVar13 + (uint)local_e0.table[local_e0.state].nbBits;
      local_118._12_4_ = local_118._12_4_;
      local_118.bitsConsumed = uVar8;
      local_50 = local_50 + local_60;
      local_e0.state =
           (ulong)((uint)(local_118.bitContainer >> (-(char)uVar8 & 0x3fU)) &
                  BIT_mask[local_e0.table[local_e0.state].nbBits]) +
           (ulong)local_e0.table[local_e0.state].nextState;
      sStack_48 = sVar20;
      local_40 = local_c0[0];
      uVar18 = local_50 + sVar20;
      pBVar2 = pBVar16 + uVar18;
      uVar19 = 0xffffffffffffffba;
      if (pBVar2 <= oend_00) {
        pBVar10 = local_120 + local_50;
        uVar19 = 0xffffffffffffffec;
        if (pBVar10 <= litLimit) {
          pBVar14 = pBVar16 + local_50;
          if (pBVar1 < pBVar14) {
            sequence.matchLength = sVar20;
            sequence.litLength = local_50;
            sequence.offset = local_c0[0];
            sequence.match = pBStack_38;
            uVar19 = ZSTD_execSequenceLast7
                               (pBVar16,oend_00,sequence,&local_120,litLimit,base,local_80,local_88)
            ;
          }
          else {
            *(undefined8 *)pBVar16 = *(undefined8 *)local_120;
            if (8 < local_50) {
              pBVar11 = pBVar16 + 8;
              do {
                local_120 = local_120 + 8;
                *(undefined8 *)pBVar11 = *(undefined8 *)local_120;
                pBVar11 = pBVar11 + 8;
              } while (pBVar11 < pBVar14);
            }
            pBVar11 = pBVar14 + -local_c0[0];
            local_120 = pBVar10;
            if ((ulong)((long)pBVar14 - (long)base) < local_c0[0]) {
              if (local_c0[0] <= (ulong)((long)pBVar14 - (long)local_80)) {
                lVar9 = (long)(pBVar14 + -local_c0[0]) - (long)base;
                pBVar10 = local_88 + lVar9;
                if (local_88 < pBVar10 + sVar20) {
                  memmove(pBVar14,pBVar10,-lVar9);
                  pBVar14 = pBVar14 + -lVar9;
                  sStack_48 = sVar20 + lVar9;
                  if ((pBVar14 <= pBVar1) && (pBVar11 = base, 2 < sStack_48)) goto LAB_004be72d;
                  uVar19 = uVar18;
                  if (sStack_48 != 0) {
                    uVar17 = 0;
                    do {
                      pBVar14[uVar17] = base[uVar17];
                      uVar17 = uVar17 + 1;
                    } while ((uVar17 & 0xffffffff) < sStack_48);
                  }
                }
                else {
                  memmove(pBVar14,pBVar10,sVar20);
                  uVar19 = uVar18;
                }
              }
            }
            else {
LAB_004be72d:
              if (uVar17 < 8) {
                iVar13 = *(int *)(ZSTD_execSequence_dec64table + uVar17 * 4);
                *pBVar14 = *pBVar11;
                pBVar14[1] = pBVar11[1];
                pBVar14[2] = pBVar11[2];
                pBVar14[3] = pBVar11[3];
                pBVar10 = pBVar11 + *(uint *)(ZSTD_execSequence_dec32table + local_40 * 4);
                pBVar11 = pBVar11 + ((ulong)*(uint *)(ZSTD_execSequence_dec32table + local_40 * 4) -
                                    (long)iVar13);
                *(undefined4 *)(pBVar14 + 4) = *(undefined4 *)pBVar10;
              }
              else {
                *(undefined8 *)pBVar14 = *(undefined8 *)pBVar11;
              }
              pBVar10 = pBVar14 + 8;
              pBVar11 = pBVar11 + 8;
              if (local_78 < pBVar2) {
                pBVar14 = pBVar10;
                pBVar12 = pBVar11;
                if (pBVar10 < pBVar1) {
                  do {
                    *(undefined8 *)pBVar14 = *(undefined8 *)pBVar12;
                    pBVar14 = pBVar14 + 8;
                    pBVar12 = pBVar12 + 8;
                  } while (pBVar14 < pBVar1);
                  pBVar11 = pBVar11 + ((long)pBVar1 - (long)pBVar10);
                  pBVar10 = pBVar1;
                }
                for (; uVar19 = uVar18, pBVar10 < pBVar2; pBVar10 = pBVar10 + 1) {
                  BVar6 = *pBVar11;
                  pBVar11 = pBVar11 + 1;
                  *pBVar10 = BVar6;
                }
              }
              else {
                do {
                  *(undefined8 *)pBVar10 = *(undefined8 *)pBVar11;
                  pBVar10 = pBVar10 + 8;
                  pBVar11 = pBVar11 + 8;
                  uVar19 = uVar18;
                } while (pBVar10 < pBVar14 + sStack_48);
              }
            }
          }
        }
      }
      uVar17 = 0;
      if (uVar19 < 0xffffffffffffff89) {
        uVar17 = uVar19;
      }
      pBVar16 = pBVar16 + uVar17;
      uVar17 = local_58;
      nbSeq = local_8c;
    } while (uVar19 < 0xffffffffffffff89);
    bVar7 = false;
    uVar17 = uVar19;
  }
LAB_004be87e:
  if (!bVar7) {
    return uVar17;
  }
LAB_004be882:
  sVar20 = (long)litLimit - (long)local_120;
  if ((ulong)((long)oend_00 - (long)pBVar16) < sVar20) {
    pBVar16 = (BYTE *)0xffffffffffffffba;
  }
  else {
    memcpy(pBVar16,local_120,sVar20);
    pBVar16 = pBVar16 + (sVar20 - (long)dst);
  }
  return (size_t)pBVar16;
}

Assistant:

static size_t
ZSTD_decompressSequences(ZSTD_DCtx* dctx, void* dst, size_t maxDstSize,
                   const void* seqStart, size_t seqSize, int nbSeq,
                   const ZSTD_longOffset_e isLongOffset)
{
    DEBUGLOG(5, "ZSTD_decompressSequences");
#if DYNAMIC_BMI2
    if (dctx->bmi2) {
        return ZSTD_decompressSequences_bmi2(dctx, dst, maxDstSize, seqStart, seqSize, nbSeq, isLongOffset);
    }
#endif
  return ZSTD_decompressSequences_default(dctx, dst, maxDstSize, seqStart, seqSize, nbSeq, isLongOffset);
}